

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

void __thiscall
icu_63::TimeZoneNamesImpl::getDisplayNames
          (TimeZoneNamesImpl *this,UnicodeString *tzID,UTimeZoneNameType *types,int32_t numTypes,
          UDate date,UnicodeString *dest,UErrorCode *status)

{
  UErrorCode UVar1;
  UTimeZoneNameType type;
  UErrorCode *pUVar2;
  UTimeZoneNameTypeIndex UVar3;
  char *pcVar4;
  UChar *pUVar5;
  ZNames *pZVar6;
  ulong uVar7;
  UnicodeString mzID;
  ConstChar16Ptr local_b0;
  UErrorCode *local_a8;
  UObject local_a0;
  UDate local_98;
  ZNames *local_90;
  UTimeZoneNameType *local_88;
  UChar *local_80;
  UnicodeString local_70;
  
  if ((*status < U_ILLEGAL_ARGUMENT_ERROR) &&
     (0x1f < (ushort)(tzID->fUnion).fStackFields.fLengthAndFlags)) {
    local_a8 = status;
    local_98 = date;
    local_88 = types;
    umtx_lock_63((UMutex *)gDataMutex);
    pUVar2 = local_a8;
    local_90 = loadTimeZoneNames(this,tzID,local_a8);
    UVar1 = *pUVar2;
    umtx_unlock_63((UMutex *)gDataMutex);
    if (0 < numTypes && UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
      uVar7 = 0;
      local_a0._vptr_UObject = (_func_int **)&PTR__UnicodeString_00487e70;
      pcVar4 = (char *)(ZNames *)0x0;
      do {
        type = local_88[uVar7];
        UVar3 = ZNames::getTZNameTypeIndex(type);
        if ((UVar3 < UTZNM_INDEX_EXEMPLAR_LOCATION) ||
           (pUVar5 = local_90->fNames[(uint)UVar3], pUVar5 == (UChar *)0x0)) {
          if ((ZNames *)pcVar4 == (ZNames *)0x0) {
            local_70.super_Replaceable.super_UObject._vptr_UObject =
                 (UObject)(UObject)local_a0._vptr_UObject;
            local_70.fUnion.fStackFields.fLengthAndFlags = 2;
            (*(this->super_TimeZoneNames).super_UObject._vptr_UObject[7])
                      (local_98,this,tzID,&local_70);
            if (0x1f < (ushort)local_70.fUnion.fStackFields.fLengthAndFlags) {
              umtx_lock_63((UMutex *)gDataMutex);
              pUVar2 = local_a8;
              pcVar4 = (char *)loadMetaZoneNames(this,&local_70,local_a8);
              UVar1 = *pUVar2;
              umtx_unlock_63((UMutex *)gDataMutex);
              if ((ZNames *)pcVar4 == (ZNames *)0x0) {
                pcVar4 = "<empty>";
              }
              icu_63::UnicodeString::~UnicodeString(&local_70);
              if (U_ZERO_ERROR < UVar1) {
                return;
              }
              goto LAB_00283fb3;
            }
            icu_63::UnicodeString::~UnicodeString(&local_70);
            pZVar6 = (ZNames *)"<empty>";
          }
          else {
LAB_00283fb3:
            pZVar6 = (ZNames *)"<empty>";
            if (((pcVar4 != "<empty>") &&
                (UVar3 = ZNames::getTZNameTypeIndex(type), pZVar6 = (ZNames *)pcVar4,
                UTZNM_INDEX_UNKNOWN < UVar3)) &&
               (pUVar5 = ((ZNames *)pcVar4)->fNames[(uint)UVar3], pUVar5 != (UChar *)0x0))
            goto LAB_00283fdb;
          }
          icu_63::UnicodeString::setToBogus(dest);
        }
        else {
LAB_00283fdb:
          local_b0.p_ = pUVar5;
          icu_63::UnicodeString::setTo(dest,'\x01',&local_b0,-1);
          local_80 = local_b0.p_;
          pZVar6 = (ZNames *)pcVar4;
        }
        uVar7 = uVar7 + 1;
        dest = dest + 1;
        pcVar4 = (char *)pZVar6;
      } while ((uint)numTypes != uVar7);
    }
  }
  return;
}

Assistant:

void TimeZoneNamesImpl::getDisplayNames(const UnicodeString& tzID,
        const UTimeZoneNameType types[], int32_t numTypes,
        UDate date, UnicodeString dest[], UErrorCode& status) const {
    if (U_FAILURE(status)) return;

    if (tzID.isEmpty()) { return; }
    void* tznames = NULL;
    void* mznames = NULL;
    TimeZoneNamesImpl *nonConstThis = const_cast<TimeZoneNamesImpl*>(this);

    // Load the time zone strings
    {
        Mutex lock(&gDataMutex);
        tznames = (void*) nonConstThis->loadTimeZoneNames(tzID, status);
        if (U_FAILURE(status)) { return; }
    }
    U_ASSERT(tznames != NULL);

    // Load the values into the dest array
    for (int i = 0; i < numTypes; i++) {
        UTimeZoneNameType type = types[i];
        const UChar* name = ((ZNames*)tznames)->getName(type);
        if (name == NULL) {
            if (mznames == NULL) {
                // Load the meta zone name
                UnicodeString mzID;
                getMetaZoneID(tzID, date, mzID);
                if (mzID.isEmpty()) {
                    mznames = (void*) EMPTY;
                } else {
                    // Load the meta zone strings
                    // Mutex is scoped to the "else" statement
                    Mutex lock(&gDataMutex);
                    mznames = (void*) nonConstThis->loadMetaZoneNames(mzID, status);
                    if (U_FAILURE(status)) { return; }
                    // Note: when the metazone doesn't exist, in Java, loadMetaZoneNames returns
                    // a dummy object instead of NULL.
                    if (mznames == NULL) {
                        mznames = (void*) EMPTY;
                    }
                }
            }
            U_ASSERT(mznames != NULL);
            if (mznames != EMPTY) {
                name = ((ZNames*)mznames)->getName(type);
            }
        }
        if (name != NULL) {
            dest[i].setTo(TRUE, name, -1);
        } else {
            dest[i].setToBogus();
        }
    }
}